

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

void clear_comments(char *p)

{
  int iVar1;
  char *local_10;
  char *p_local;
  
  local_10 = p;
  while (iVar1 = is_conf_ws(*local_10), iVar1 != 0) {
    local_10 = local_10 + 1;
  }
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = is_comment(*local_10);
        if (iVar1 != 0) {
          *local_10 = '\0';
          return;
        }
        iVar1 = is_quote(*local_10);
        if (iVar1 == 0) break;
        local_10 = scan_quote(local_10);
      }
      iVar1 = is_esc(*local_10);
      if (iVar1 == 0) break;
      local_10 = scan_esc(local_10);
    }
    if (*local_10 == '\0') break;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

static void clear_comments(char *p) {
  for (;;) {
    if (!is_conf_ws(*p)) {
      break;
    }
    p++;
  }

  for (;;) {
    if (is_comment(*p)) {
      *p = '\0';
      return;
    }
    if (is_quote(*p)) {
      p = scan_quote(p);
      continue;
    }
    if (is_esc(*p)) {
      p = scan_esc(p);
      continue;
    }
    if (*p == '\0') {
      return;
    } else {
      p++;
    }
  }
}